

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O3

void __thiscall OpenMD::NPA::scaleSimBox(NPA *this)

{
  uint i;
  double *pdVar1;
  long lVar2;
  long lVar3;
  uint j;
  long lVar4;
  double *pdVar5;
  uint k;
  double (*__return_storage_ptr__) [3];
  double dVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined8 uVar10;
  SquareMatrix3<double> result;
  Mat3x3d hmat;
  double local_f8 [9];
  Mat3x3d local_b0;
  double local_68 [10];
  long lVar8;
  
  pdVar1 = local_68 + 1;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar7 = _DAT_0028d380;
    do {
      bVar9 = SUB164(auVar7 ^ _DAT_0028d390,4) == -0x80000000 &&
              SUB164(auVar7 ^ _DAT_0028d390,0) < -0x7ffffffd;
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar2 != lVar4) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)pdVar1 + lVar4 + -8) = uVar10;
      }
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar2 + -8 != lVar4) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)pdVar1 + lVar4) = uVar10;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x20);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 8;
    pdVar1 = pdVar1 + 3;
  } while (lVar3 != 3);
  local_68[8] = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
                    (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][2]);
  __return_storage_ptr__ = (double (*) [3])&local_b0;
  Snapshot::getHmat((Mat3x3d *)__return_storage_ptr__,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    pdVar1 = local_68;
    do {
      dVar6 = local_f8[lVar2 * 3 + lVar3];
      lVar4 = 0;
      pdVar5 = pdVar1;
      do {
        dVar6 = dVar6 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                        super_RectMatrix<double,_3U,_3U>).data_[0][lVar4] * *pdVar5;
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar4 != 3);
      local_f8[lVar2 * 3 + lVar3] = dVar6;
      lVar3 = lVar3 + 1;
      pdVar1 = pdVar1 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(undefined8 *)
     ((long)local_b0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar2 + 0x10) = *(undefined8 *)((long)local_f8 + lVar2 + 0x10);
    uVar10 = *(undefined8 *)((long)local_f8 + lVar2 + 8);
    *(undefined8 *)
     ((long)local_b0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar2
     ) = *(undefined8 *)((long)local_f8 + lVar2);
    *(undefined8 *)
     ((long)local_b0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar2 + 8) = uVar10;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,&local_b0
                   );
  return;
}

Assistant:

void NPA::scaleSimBox() {
    Mat3x3d scaleMat;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    scaleMat(2, 2) = exp(dt * eta(2, 2));
    Mat3x3d hmat   = snap->getHmat();
    hmat           = hmat * scaleMat;
    snap->setHmat(hmat);
  }